

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_ubjson_value(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                   *this,char_int_type prefix)

{
  byte *pbVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  _func_int *UNRECOVERED_JUMPTABLE;
  exception eVar6;
  undefined8 uVar7;
  json_sax_t *pjVar8;
  string_t s;
  string last_token;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  pointer local_b0;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  if (99 < prefix) {
    if (prefix < 0x7b) {
      if (prefix == 100) {
        local_a8._M_dataplus._M_p = local_a8._M_dataplus._M_p & 0xffffffff00000000;
        bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                ::get_number<float,false>
                          ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                            *)this,ubjson,(float *)&local_a8);
        if (bVar3) {
          pjVar8 = this->sax;
          local_b0 = (pointer)CONCAT44(local_b0._4_4_,local_a8._M_dataplus._M_p._0_4_);
          local_d8._0_8_ = local_d8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
          iVar5 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[4])
                            ((double)local_b0._0_4_,pjVar8,local_d8);
          binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
          ::get_ubjson_value((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                              *)local_d8);
          eVar6 = SUB41(iVar5,0);
        }
        else {
          eVar6 = (exception)0x0;
        }
        goto LAB_0010ebae;
      }
      if (prefix == 0x69) {
        binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
        ::get_ubjson_value();
        eVar6 = local_d8[0];
        goto LAB_0010ebae;
      }
      if (prefix == 0x6c) {
        binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
        ::get_ubjson_value();
        eVar6 = local_d8[0];
        goto LAB_0010ebae;
      }
    }
    else if (prefix == 0x7b) {
      bVar3 = get_ubjson_object(this);
      return bVar3;
    }
    goto switchD_0010e8df_caseD_45;
  }
  switch(prefix) {
  case 0x43:
    this->chars_read = this->chars_read + 1;
    pbVar1 = (byte *)(this->ia).current._M_current;
    if (pbVar1 == (byte *)(this->ia).end._M_current) {
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = (uint)*pbVar1;
      (this->ia).current._M_current = (char *)(pbVar1 + 1);
    }
    this->current = uVar4;
    bVar3 = unexpect_eof(this,ubjson,"char");
    if (!bVar3) {
      eVar6 = (exception)0x0;
      break;
    }
    if (this->current < 0x80) {
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct((ulong)local_d8,'\x01');
      iVar5 = (*(this->sax->super_json_sax_t)._vptr_json_sax[5])(this->sax,local_d8);
      binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
      ::get_ubjson_value();
      eVar6 = SUB41(iVar5,0);
      break;
    }
    get_token_string(&local_a8,this);
    sVar2 = this->chars_read;
    pjVar8 = this->sax;
    std::operator+(&local_68,"byte after \'C\' must be in range 0x00..0x7F; last byte: 0x",&local_a8
                  );
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"char","");
    exception_message(&local_48,this,ubjson,&local_68,&local_88);
    parse_error::create((parse_error *)local_d8,0x71,sVar2,&local_48);
    iVar5 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[0xc])(pjVar8,sVar2,&local_a8,local_d8);
    eVar6 = SUB41(iVar5,0);
    goto LAB_0010eb1b;
  case 0x44:
    local_a8._M_dataplus._M_p = (pointer)0x0;
    bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<double,false>
                      ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                        *)this,ubjson,(double *)&local_a8);
    if (bVar3) {
      pjVar8 = this->sax;
      local_b0 = local_a8._M_dataplus._M_p;
      local_d8._0_8_ = local_d8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"");
      iVar5 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[4])(local_b0,pjVar8,local_d8);
      binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
      ::get_ubjson_value((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                          *)local_d8);
      eVar6 = SUB41(iVar5,0);
    }
    else {
      eVar6 = (exception)0x0;
    }
    break;
  case 0x46:
    pjVar8 = this->sax;
    UNRECOVERED_JUMPTABLE = (pjVar8->super_json_sax_t)._vptr_json_sax[1];
    uVar7 = 0;
    goto LAB_0010ea3d;
  case 0x48:
    bVar3 = get_ubjson_high_precision_number(this);
    return bVar3;
  case 0x49:
    binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
    ::get_ubjson_value();
    eVar6 = local_d8[0];
    break;
  case 0x4c:
    binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
    ::get_ubjson_value();
    eVar6 = local_d8[0];
    break;
  case 0x53:
    local_d8._8_8_ = 0;
    local_c8._M_local_buf[0] = '\0';
    local_d8._0_8_ = local_d8 + 0x10;
    bVar3 = get_ubjson_string(this,(string_t *)local_d8,true);
    if (bVar3) {
      iVar5 = (*(this->sax->super_json_sax_t)._vptr_json_sax[5])(this->sax,local_d8);
      eVar6 = SUB41(iVar5,0);
    }
    else {
      eVar6 = (exception)0x0;
    }
    if ((undefined1 *)local_d8._0_8_ == local_d8 + 0x10) break;
    local_a8.field_2._M_allocated_capacity =
         CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]);
    local_a8._M_dataplus._M_p = (pointer)local_d8._0_8_;
    goto LAB_0010eba6;
  case 0x54:
    pjVar8 = this->sax;
    UNRECOVERED_JUMPTABLE = (pjVar8->super_json_sax_t)._vptr_json_sax[1];
    uVar7 = 1;
LAB_0010ea3d:
    iVar5 = (*UNRECOVERED_JUMPTABLE)(pjVar8,uVar7);
    return SUB41(iVar5,0);
  case 0x55:
    binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
    ::get_ubjson_value();
    eVar6 = local_d8[0];
    break;
  case 0x5a:
    iVar5 = (**(this->sax->super_json_sax_t)._vptr_json_sax)();
    return SUB41(iVar5,0);
  case 0x5b:
    bVar3 = get_ubjson_array(this);
    return bVar3;
  default:
    if (prefix == -1) {
      bVar3 = unexpect_eof(this,ubjson,"value");
      return bVar3;
    }
  case 0x45:
  case 0x47:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
switchD_0010e8df_caseD_45:
    get_token_string(&local_a8,this);
    sVar2 = this->chars_read;
    pjVar8 = this->sax;
    std::operator+(&local_68,"invalid byte: 0x",&local_a8);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"value","");
    exception_message(&local_48,this,ubjson,&local_68,&local_88);
    parse_error::create((parse_error *)local_d8,0x70,sVar2,&local_48);
    iVar5 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[0xc])(pjVar8,sVar2,&local_a8,local_d8);
    eVar6 = SUB41(iVar5,0);
LAB_0010eb1b:
    local_d8._0_8_ = &PTR__exception_00118d48;
    std::runtime_error::~runtime_error((runtime_error *)(local_d8 + 0x10));
    std::exception::~exception((exception *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
LAB_0010eba6:
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0010ebae:
  return (bool)((byte)eVar6 & 1);
}

Assistant:

bool get_ubjson_value(const char_int_type prefix)
    {
        switch (prefix)
        {
            case std::char_traits<char_type>::eof():  // EOF
                return unexpect_eof(input_format_t::ubjson, "value");

            case 'T':  // true
                return sax->boolean(true);
            case 'F':  // false
                return sax->boolean(false);

            case 'Z':  // null
                return sax->null();

            case 'U':
            {
                std::uint8_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_unsigned(number);
            }

            case 'i':
            {
                std::int8_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'I':
            {
                std::int16_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'l':
            {
                std::int32_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'L':
            {
                std::int64_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'd':
            {
                float number{};
                return get_number(input_format_t::ubjson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'D':
            {
                double number{};
                return get_number(input_format_t::ubjson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'H':
            {
                return get_ubjson_high_precision_number();
            }

            case 'C':  // char
            {
                get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "char")))
                {
                    return false;
                }
                if (JSON_HEDLEY_UNLIKELY(current > 127))
                {
                    auto last_token = get_token_string();
                    return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::ubjson, "byte after 'C' must be in range 0x00..0x7F; last byte: 0x" + last_token, "char")));
                }
                string_t s(1, static_cast<typename string_t::value_type>(current));
                return sax->string(s);
            }

            case 'S':  // string
            {
                string_t s;
                return get_ubjson_string(s) && sax->string(s);
            }

            case '[':  // array
                return get_ubjson_array();

            case '{':  // object
                return get_ubjson_object();

            default: // anything else
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::ubjson, "invalid byte: 0x" + last_token, "value")));
            }
        }
    }